

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

void __thiscall crnlib::mip_level::clear(mip_level *this)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  this->m_format = PIXEL_FMT_INVALID;
  this->m_orient_flags = cDefaultOrientationFlags;
  if (this->m_pImage != (image_u8 *)0x0) {
    crnlib_delete<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
              ((crnlib *)this->m_pImage,in_RSI);
    this->m_pImage = (image_u8 *)0x0;
  }
  if (this->m_pDXTImage != (dxt_image *)0x0) {
    crnlib_delete<crnlib::dxt_image>(this->m_pDXTImage);
    this->m_pDXTImage = (dxt_image *)0x0;
  }
  return;
}

Assistant:

void mip_level::clear() {
  m_width = 0;
  m_height = 0;
  m_comp_flags = pixel_format_helpers::cDefaultCompFlags;
  m_format = PIXEL_FMT_INVALID;
  m_orient_flags = cDefaultOrientationFlags;

  if (m_pImage) {
    crnlib_delete(m_pImage);
    m_pImage = nullptr;
  }

  if (m_pDXTImage) {
    crnlib_delete(m_pDXTImage);
    m_pDXTImage = nullptr;
  }
}